

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall LogStream::operator<<(LogStream *this,short v)

{
  undefined2 in_register_00000032;
  
  formatInteger<int>(this,CONCAT22(in_register_00000032,v));
  return this;
}

Assistant:

LogStream& LogStream::operator<<(short v) {
    *this << static_cast<int>(v);
    return *this;
}